

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O3

vector<serial::PortInfo,_std::allocator<serial::PortInfo>_> * serial::list_ports(void)

{
  int iVar1;
  long lVar2;
  pointer pcVar3;
  vector<serial::PortInfo,_std::allocator<serial::PortInfo>_> *in_RDI;
  string *psVar4;
  pointer pbVar5;
  string sys_id_path;
  string hardware_id;
  string friendly_name;
  glob_t glob_results;
  string sys_device_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  search_globs;
  string hardware_id_1;
  string device;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sysfs_info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  devices_found;
  string *local_1f8 [2];
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined1 local_168;
  undefined7 uStack_167;
  _func_4978 *local_158;
  __time_t local_150;
  undefined1 local_148;
  undefined7 uStack_147;
  string local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  vector<serial::PortInfo,_std::allocator<serial::PortInfo>_> *local_d0;
  value_type local_c8;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  long *local_50 [2];
  long local_40 [2];
  
  (in_RDI->super__Vector_base<serial::PortInfo,_std::allocator<serial::PortInfo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->super__Vector_base<serial::PortInfo,_std::allocator<serial::PortInfo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<serial::PortInfo,_std::allocator<serial::PortInfo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198._0_8_ = local_188;
  local_d0 = in_RDI;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"/dev/ttyACM*","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
  if ((undefined1 *)local_198._0_8_ != local_188) {
    operator_delete((void *)local_198._0_8_,CONCAT71(local_188._1_7_,local_188[0]) + 1);
  }
  local_198._0_8_ = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"/dev/ttyS*","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
  if ((undefined1 *)local_198._0_8_ != local_188) {
    operator_delete((void *)local_198._0_8_,CONCAT71(local_188._1_7_,local_188[0]) + 1);
  }
  local_198._0_8_ = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"/dev/ttyUSB*","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
  if ((undefined1 *)local_198._0_8_ != local_188) {
    operator_delete((void *)local_198._0_8_,CONCAT71(local_188._1_7_,local_188[0]) + 1);
  }
  local_198._0_8_ = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"/dev/tty.*","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
  if ((undefined1 *)local_198._0_8_ != local_188) {
    operator_delete((void *)local_198._0_8_,CONCAT71(local_188._1_7_,local_188[0]) + 1);
  }
  local_198._0_8_ = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"/dev/cu.*","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
  if ((string *)local_198._0_8_ != (string *)local_188) {
    operator_delete((void *)local_198._0_8_,CONCAT71(local_188._1_7_,local_188[0]) + 1);
  }
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    glob(((local_e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,0,(__errfunc *)0x0,
         (glob_t *)local_198);
    pbVar5 = local_e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
    if (pbVar5 != local_e8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        glob((pbVar5->_M_dataplus)._M_p,0x20,(__errfunc *)0x0,(glob_t *)local_198);
        pbVar5 = pbVar5 + 1;
      } while (pbVar5 != local_e8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((string *)local_198._0_8_ != (string *)0x0) {
      psVar4 = (string *)0x0;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b8,*(char **)(local_198._8_8_ + psVar4 * 8),
                   (allocator<char> *)(local_1e8 + 0x10));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                   &local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        psVar4 = (string *)((long)&(psVar4->_M_dataplus)._M_p + 1);
      } while (psVar4 < (ulong)local_198._0_8_);
    }
    globfree((glob_t *)local_198);
    if (local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar5 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_a8 = local_98;
        pcVar3 = (pbVar5->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar3,pcVar3 + pbVar5->_M_string_length);
        lVar2 = std::__cxx11::string::rfind((char *)&local_a8,0x10da09,0xffffffffffffffff);
        if (lVar2 == -1) {
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,local_a8,local_a0 + (long)local_a8);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&local_1b8,(string *)&local_a8,lVar2 + 1,0xffffffffffffffff);
        }
        local_1d8._M_allocated_capacity = (size_type)&local_1c8;
        local_1d8._8_8_ = 0;
        local_1c8._M_local_buf[0] = '\0';
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        local_c8._M_string_length = 0;
        local_c8.field_2._M_local_buf[0] = '\0';
        format_abi_cxx11_(&local_108,"/sys/class/tty/%s/device",local_1b8._M_dataplus._M_p);
        iVar1 = std::__cxx11::string::compare((ulong)&local_1b8,0,(char *)0x6);
        if (iVar1 == 0) {
          realpath((char *)local_50,local_108._M_dataplus._M_p);
          dirname((char *)local_1f8);
          dirname((char *)local_198);
          std::__cxx11::string::operator=((string *)&local_108,(string *)local_198);
          if ((string *)local_198._0_8_ != (string *)local_188) {
            operator_delete((void *)local_198._0_8_,CONCAT71(local_188._1_7_,local_188[0]) + 1);
          }
          if (local_1f8[0] != (string *)local_1e8) {
            operator_delete(local_1f8[0],(ulong)(local_1e8._0_8_ + 1));
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          iVar1 = stat(local_108._M_dataplus._M_p,(stat *)local_198);
          if (iVar1 == 0) {
            usb_sysfs_friendly_name((string *)local_198,&local_108);
            std::__cxx11::string::operator=((string *)(local_1e8 + 0x10),(string *)local_198);
            if ((string *)local_198._0_8_ != (string *)local_188) {
              operator_delete((void *)local_198._0_8_,CONCAT71(local_188._1_7_,local_188[0]) + 1);
            }
            usb_sysfs_hw_string((string *)local_198,&local_108);
LAB_0010ba9c:
            std::__cxx11::string::operator=((string *)&local_c8,(string *)local_198);
            if ((string *)local_198._0_8_ != (string *)local_188) {
              pcVar3 = (pointer)CONCAT71(local_188._1_7_,local_188[0]);
              psVar4 = (string *)local_198._0_8_;
              goto LAB_0010bac0;
            }
          }
        }
        else {
          iVar1 = std::__cxx11::string::compare((ulong)&local_1b8,0,(char *)0x6);
          if (iVar1 == 0) {
            realpath((char *)local_1f8,local_108._M_dataplus._M_p);
            dirname((char *)local_198);
            std::__cxx11::string::operator=((string *)&local_108,(string *)local_198);
            if ((string *)local_198._0_8_ != (string *)local_188) {
              operator_delete((void *)local_198._0_8_,CONCAT71(local_188._1_7_,local_188[0]) + 1);
            }
            if (local_1f8[0] != (string *)local_1e8) {
              operator_delete(local_1f8[0],(ulong)(local_1e8._0_8_ + 1));
            }
            iVar1 = stat(local_108._M_dataplus._M_p,(stat *)local_198);
            if (iVar1 == 0) {
              usb_sysfs_friendly_name((string *)local_198,&local_108);
              std::__cxx11::string::operator=((string *)(local_1e8 + 0x10),(string *)local_198);
              if ((string *)local_198._0_8_ != (string *)local_188) {
                operator_delete((void *)local_198._0_8_,CONCAT71(local_188._1_7_,local_188[0]) + 1);
              }
              usb_sysfs_hw_string((string *)local_198,&local_108);
              goto LAB_0010ba9c;
            }
          }
          else {
            local_1f8[0] = (string *)local_1e8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1f8,local_108._M_dataplus._M_p,
                       local_108._M_dataplus._M_p + local_108._M_string_length);
            std::__cxx11::string::append((char *)local_1f8);
            iVar1 = stat((char *)local_1f8[0],(stat *)local_198);
            if (iVar1 == 0) {
              read_line((string *)local_198,local_1f8[0]);
              std::__cxx11::string::operator=((string *)&local_c8,(string *)local_198);
              if ((string *)local_198._0_8_ != (string *)local_188) {
                operator_delete((void *)local_198._0_8_,CONCAT71(local_188._1_7_,local_188[0]) + 1);
              }
            }
            pcVar3 = (pointer)local_1e8._0_8_;
            psVar4 = local_1f8[0];
            if (local_1f8[0] != (string *)local_1e8) {
LAB_0010bac0:
              operator_delete(psVar4,(ulong)(pcVar3 + 1));
            }
          }
        }
        if (local_1d8._8_8_ == 0) {
          std::__cxx11::string::_M_assign((string *)(local_1e8 + 0x10));
        }
        if (local_c8._M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)0x0,0x10da05);
        }
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_88,(value_type *)(local_1e8 + 0x10));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_88,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                   local_c8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_allocated_capacity != &local_1c8) {
          operator_delete((void *)local_1d8._M_allocated_capacity,
                          CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        pcVar3 = ((local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,pcVar3,
                   pcVar3 + (local_88.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        local_1d8._M_allocated_capacity = (size_type)&local_1c8;
        pcVar3 = local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_1e8 + 0x10),pcVar3,
                   pcVar3 + local_88.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
        local_198._0_8_ = local_188;
        local_198._8_8_ = (char **)0x0;
        local_188[0] = '\0';
        local_178._M_allocated_capacity = (size_type)&local_168;
        local_178._8_8_ = 0;
        local_168 = 0;
        local_158 = (_func_4978 *)&local_148;
        local_150 = 0;
        local_148 = (_func_4978)0x0;
        std::__cxx11::string::_M_assign((string *)local_198);
        std::__cxx11::string::_M_assign((string *)(local_188 + 0x10));
        std::__cxx11::string::_M_assign((string *)&local_158);
        std::vector<serial::PortInfo,_std::allocator<serial::PortInfo>_>::push_back
                  (local_d0,(value_type *)local_198);
        if (local_158 != (_func_4978 *)&local_148) {
          operator_delete(local_158,CONCAT71(uStack_147,local_148) + 1);
        }
        if ((undefined1 *)local_178._M_allocated_capacity != &local_168) {
          operator_delete((void *)local_178._M_allocated_capacity,CONCAT71(uStack_167,local_168) + 1
                         );
        }
        if ((string *)local_198._0_8_ != (string *)local_188) {
          operator_delete((void *)local_198._0_8_,CONCAT71(local_188._1_7_,local_188[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_allocated_capacity != &local_1c8) {
          operator_delete((void *)local_1d8._M_allocated_capacity,
                          CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_88);
        if (local_a8 != local_98) {
          operator_delete(local_a8,local_98[0] + 1);
        }
        pbVar5 = pbVar5 + 1;
      } while (pbVar5 != local_68.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  return local_d0;
}

Assistant:

vector<PortInfo>
serial::list_ports()
{
    vector<PortInfo> results;

    vector<string> search_globs;
    search_globs.push_back("/dev/ttyACM*");
    search_globs.push_back("/dev/ttyS*");
    search_globs.push_back("/dev/ttyUSB*");
    search_globs.push_back("/dev/tty.*");
    search_globs.push_back("/dev/cu.*");

    vector<string> devices_found = glob( search_globs );

    vector<string>::iterator iter = devices_found.begin();

    while( iter != devices_found.end() )
    {
        string device = *iter++;

        vector<string> sysfs_info = get_sysfs_info( device );

        string friendly_name = sysfs_info[0];

        string hardware_id = sysfs_info[1];

        PortInfo device_entry;
        device_entry.port = device;
        device_entry.description = friendly_name;
        device_entry.hardware_id = hardware_id;

        results.push_back( device_entry );

    }

    return results;
}